

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.h
# Opt level: O0

int __thiscall
TPZDohrPrecond<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>::ClassId
          (TPZDohrPrecond<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_> *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  string *str;
  allocator<char> *in_stack_fffffffffffff400;
  char *in_stack_fffffffffffff408;
  TPZDohrSubstruct<std::complex<double>_> *in_stack_fffffffffffff410;
  TPZMatrix<std::complex<double>_> *in_stack_fffffffffffff420;
  TPZDohrSubstruct<std::complex<double>_> *in_stack_fffffffffffff4b0;
  undefined1 local_29 [41];
  
  str = (string *)local_29;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff410,in_stack_fffffffffffff408,in_stack_fffffffffffff400);
  uVar1 = Hash(str);
  iVar2 = TPZMatrix<std::complex<double>_>::ClassId(in_stack_fffffffffffff420);
  TPZDohrSubstruct<std::complex<double>_>::TPZDohrSubstruct(in_stack_fffffffffffff4b0);
  iVar3 = TPZDohrSubstruct<std::complex<double>_>::ClassId(in_stack_fffffffffffff410);
  TPZDohrSubstruct<std::complex<double>_>::~TPZDohrSubstruct
            ((TPZDohrSubstruct<std::complex<double>_> *)0x1f87ff3);
  std::__cxx11::string::~string((string *)(local_29 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_29);
  return uVar1 ^ iVar2 * 2 ^ iVar3 << 2;
}

Assistant:

int TPZDohrPrecond<TVar, TSubStruct>::ClassId() const{
    return Hash("TPZDohrPrecond") ^ TPZMatrix<TVar>::ClassId() << 1 ^ TSubStruct().ClassId() << 2;
}